

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::SliceStaticLayerParams::MergePartialFromCodedStream
          (SliceStaticLayerParams *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  RepeatedField<long> *pRVar5;
  RepeatedField<bool> *pRVar6;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  SliceStaticLayerParams *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      google::protobuf::io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) {
switchD_002b9412_default:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      switch(iVar2) {
      case 1:
        if ((tag_00 & 0xff) == 10) {
          pRVar5 = mutable_beginids(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (input,pRVar5);
        }
        else {
          if ((tag_00 & 0xff) != 8) goto switchD_002b9412_default;
          pRVar5 = mutable_beginids(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (1,10,input,pRVar5);
        }
        break;
      case 2:
        if ((tag_00 & 0xff) == 0x12) {
          pRVar6 = mutable_beginmasks(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,pRVar6);
        }
        else {
          if ((tag_00 & 0xff) != 0x10) goto switchD_002b9412_default;
          pRVar6 = mutable_beginmasks(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (1,0x12,input,pRVar6);
        }
        break;
      case 3:
        if ((tag_00 & 0xff) == 0x1a) {
          pRVar5 = mutable_endids(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (input,pRVar5);
        }
        else {
          if ((tag_00 & 0xff) != 0x18) goto switchD_002b9412_default;
          pRVar5 = mutable_endids(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (1,0x1a,input,pRVar5);
        }
        break;
      case 4:
        if ((tag_00 & 0xff) == 0x22) {
          pRVar6 = mutable_endmasks(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,pRVar6);
        }
        else {
          if ((tag_00 & 0xff) != 0x20) goto switchD_002b9412_default;
          pRVar6 = mutable_endmasks(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (1,0x22,input,pRVar6);
        }
        break;
      case 5:
        if ((tag_00 & 0xff) == 0x2a) {
          pRVar5 = mutable_strides(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (input,pRVar5);
        }
        else {
          if ((tag_00 & 0xff) != 0x28) goto switchD_002b9412_default;
          pRVar5 = mutable_strides(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (1,0x2a,input,pRVar5);
        }
        break;
      case 6:
        if ((tag_00 & 0xff) == 0x32) {
          pRVar6 = mutable_squeezemasks(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,pRVar6);
        }
        else {
          if ((tag_00 & 0xff) != 0x30) goto switchD_002b9412_default;
          pRVar6 = mutable_squeezemasks(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (1,0x32,input,pRVar6);
        }
        break;
      default:
        goto switchD_002b9412_default;
      }
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool SliceStaticLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SliceStaticLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 beginIds = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_beginids())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_beginids())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool beginMasks = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_beginmasks())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 18u, input, this->mutable_beginmasks())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int64 endIds = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_endids())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(24u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 26u, input, this->mutable_endids())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool endMasks = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_endmasks())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(32u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 34u, input, this->mutable_endmasks())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int64 strides = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_strides())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(40u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 42u, input, this->mutable_strides())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool squeezeMasks = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_squeezemasks())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(48u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 50u, input, this->mutable_squeezemasks())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SliceStaticLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SliceStaticLayerParams)
  return false;
#undef DO_
}